

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

uint32_t __thiscall TldAddressAsKey::Hash(TldAddressAsKey *this)

{
  size_t sVar1;
  uint32_t uVar2;
  
  if (this->hash == 0) {
    this->hash = 0xcacab0b0;
    if (this->tld_len != 0) {
      uVar2 = this->hash;
      sVar1 = 0;
      do {
        uVar2 = (uint)this->tld[sVar1] + uVar2 * 0x65;
        this->hash = uVar2;
        sVar1 = sVar1 + 1;
      } while (this->tld_len != sVar1);
    }
    if (this->addr_len != 0) {
      uVar2 = this->hash;
      sVar1 = 0;
      do {
        uVar2 = (uint)this->addr[sVar1] + uVar2 * 0x65;
        this->hash = uVar2;
        sVar1 = sVar1 + 1;
      } while (this->addr_len != sVar1);
    }
  }
  return this->hash;
}

Assistant:

uint32_t TldAddressAsKey::Hash()
{
    if (hash == 0)
    {
        hash = 0xCACAB0B0;

        for (size_t i = 0; i < tld_len; i++)
        {
            hash = hash * 101 + tld[i];
        }

        for (size_t i = 0; i < addr_len; i++)
        {
            hash = hash * 101 + addr[i];
        }
    }

    return hash;
}